

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,REF_DBL *xyz,REF_INT *tet,REF_DBL *bary)

{
  REF_CELL ref_cell_00;
  REF_NODE ref_node_00;
  uint uVar1;
  REF_DBL local_110;
  REF_DBL local_108;
  REF_DBL local_100;
  double local_f8;
  double local_e8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL min_bary;
  REF_DBL best_bary;
  REF_INT best_guess;
  REF_INT guess;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *bary_local;
  REF_INT *tet_local;
  REF_DBL *xyz_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[8];
  ref_node_00 = ref_grid->node;
  best_bary._0_4_ = -1;
  min_bary = -999.0;
  best_bary._4_4_ = 0;
  do {
    if (ref_cell_00->max <= best_bary._4_4_) {
      if (best_bary._0_4_ == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x381,"ref_grid_exhaustive_enclosing_tet","failed to find cell");
        ref_grid_local._4_4_ = 1;
      }
      else {
        *tet = best_bary._0_4_;
        ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,best_bary._0_4_,&best_guess);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_node_bary4(ref_node_00,&best_guess,xyz,bary);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x385,"ref_grid_exhaustive_enclosing_tet",(ulong)ref_grid_local._4_4_,"bary");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 900,"ref_grid_exhaustive_enclosing_tet",(ulong)ref_grid_local._4_4_,"cell");
        }
      }
      return ref_grid_local._4_4_;
    }
    if (((-1 < best_bary._4_4_) && (best_bary._4_4_ < ref_cell_00->max)) &&
       (ref_cell_00->c2n[ref_cell_00->size_per * best_bary._4_4_] != -1)) {
      uVar1 = ref_cell_nodes(ref_cell_00,best_bary._4_4_,&best_guess);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x378,"ref_grid_exhaustive_enclosing_tet",(ulong)uVar1,"cell");
        return uVar1;
      }
      uVar1 = ref_node_bary4(ref_node_00,&best_guess,xyz,bary);
      if ((uVar1 != 0) && (uVar1 != 4)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x379,"ref_grid_exhaustive_enclosing_tet",(ulong)uVar1,"bary");
        return uVar1;
      }
      if (bary[1] <= *bary) {
        local_e8 = bary[1];
      }
      else {
        local_e8 = *bary;
      }
      if (bary[3] <= bary[2]) {
        local_f8 = bary[3];
      }
      else {
        local_f8 = bary[2];
      }
      if (local_f8 <= local_e8) {
        if (bary[3] <= bary[2]) {
          local_110 = bary[3];
        }
        else {
          local_110 = bary[2];
        }
        local_108 = local_110;
      }
      else {
        if (bary[1] <= *bary) {
          local_100 = bary[1];
        }
        else {
          local_100 = *bary;
        }
        local_108 = local_100;
      }
      if ((best_bary._0_4_ == -1) || (min_bary < local_108)) {
        best_bary._0_4_ = best_bary._4_4_;
        min_bary = local_108;
      }
    }
    best_bary._4_4_ = best_bary._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,
                                                            REF_DBL *xyz,
                                                            REF_INT *tet,
                                                            REF_DBL *bary) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT guess, best_guess;
  REF_DBL best_bary, min_bary;

  best_guess = REF_EMPTY;
  best_bary = -999.0;
  each_ref_cell_valid_cell(ref_cell, guess) {
    RSS(ref_cell_nodes(ref_cell, guess, nodes), "cell");
    RXS(ref_node_bary4(ref_node, nodes, xyz, bary), REF_DIV_ZERO, "bary");
    min_bary = MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
    if (REF_EMPTY == best_guess || min_bary > best_bary) {
      best_guess = guess;
      best_bary = min_bary;
    }
  }

  RUS(REF_EMPTY, best_guess, "failed to find cell");

  *tet = best_guess;
  RSS(ref_cell_nodes(ref_cell, best_guess, nodes), "cell");
  RSS(ref_node_bary4(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}